

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O3

istream * PyreNet::operator>>(istream *is,Perceptron *p)

{
  pointer pdVar1;
  undefined8 in_RAX;
  double *w;
  pointer pdVar2;
  int local_24 [2];
  int weightSize;
  
  local_24[0] = (int)((ulong)in_RAX >> 0x20);
  std::istream::operator>>((istream *)is,&p->inputSize);
  std::istream::operator>>((istream *)is,local_24);
  std::vector<double,_std::allocator<double>_>::resize(&p->weights,(long)local_24[0]);
  pdVar1 = (p->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (p->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    std::istream::_M_extract<double>((double *)is);
  }
  return is;
}

Assistant:

std::istream& operator>>(std::istream& is, Perceptron &p) {
        is >> p.inputSize;
        int weightSize;
        is >> weightSize;
        p.weights.resize(weightSize);
        for (double& w : p.weights)
            is >> w;
        return is;
    }